

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextbookBoyerMoore.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::TextbookBoyerMooreSetup<char16_t>::Init(TextbookBoyerMooreSetup<char16_t> *this)

{
  uint uVar1;
  Char *pCVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Scheme SVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  
  uVar7 = this->patLen;
  if (uVar7 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/TextbookBoyerMoore.cpp"
                       ,0xc,"(patLen > 0)","patLen > 0");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
    uVar7 = this->patLen;
  }
  this->lastOcc[0] = -1;
  this->lastOcc[1] = -1;
  this->lastOcc[2] = -1;
  this->lastOcc[3] = -1;
  this->numLinearChars = 1;
  pCVar2 = this->pat;
  SVar6 = LinearScheme;
  this->linearChar[0] = pCVar2[uVar7 - 1];
  if (uVar7 != 0) {
    uVar8 = 1;
    uVar9 = 0;
    do {
      lVar10 = 0;
      if (uVar8 == 0) {
LAB_00f056f3:
        if ((uint)lVar10 == uVar8) goto LAB_00f056f8;
      }
      else {
        lVar10 = 0;
        do {
          if (this->linearChar[lVar10] == pCVar2[uVar9]) {
            this->lastOcc[lVar10] = (int32)uVar9;
            goto LAB_00f056f3;
          }
          lVar10 = lVar10 + 1;
        } while (uVar8 != (uint)lVar10);
LAB_00f056f8:
        if (uVar8 == 4) {
          this->numLinearChars = 5;
          SVar6 = DefaultScheme;
          goto LAB_00f05738;
        }
        this->linearChar[uVar8] = pCVar2[uVar9];
        this->lastOcc[uVar8] = (int32)uVar9;
        uVar1 = uVar8 + 1;
        this->numLinearChars = uVar1;
        bVar4 = 3 < uVar8;
        uVar8 = uVar1;
        if (bVar4) break;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar7);
    SVar6 = (Scheme)(uVar8 < 5);
  }
LAB_00f05738:
  this->scheme = SVar6;
  return;
}

Assistant:

void TextbookBoyerMooreSetup<C>::Init()
    {
        Assert(patLen > 0);
        for (uint i = 0; i < MaxCharMapLinearChars; i++)
        {
            lastOcc[i] = -1;
        }

        numLinearChars = 1;

        // Always put the last character in the first index
        linearChar[0] = pat[patLen - 1];
        for (CharCount i = 0; i < patLen; i++)
        {
            if (numLinearChars <= MaxCharMapLinearChars)
            {
                uint j = 0;
                for (; j < numLinearChars; j++)
                {
                    if (linearChar[j] == pat[i])
                    {
                        lastOcc[j] = i;
                        break;
                    }
                }
                if (j == numLinearChars)
                {
                    if (numLinearChars < MaxCharMapLinearChars)
                    {
                        linearChar[numLinearChars] = pat[i];
                        lastOcc[numLinearChars] = i;
                    }
                    numLinearChars++;
                }
            }

            if (numLinearChars > MaxCharMapLinearChars)
            {
                break;
            }
        }
        if (numLinearChars <= MaxCharMapLinearChars)
        {
            scheme = LinearScheme;
        }
        else
        {
            scheme = DefaultScheme;
        }
    }